

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

PoolingLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_pooling(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x78) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x78;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x58);
    PoolingLayerParams::PoolingLayerParams(this_00.pooling_);
    (this->layer_).pooling_ = (PoolingLayerParams *)this_00;
  }
  return (PoolingLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::PoolingLayerParams* NeuralNetworkLayer::mutable_pooling() {
  if (!has_pooling()) {
    clear_layer();
    set_has_pooling();
    layer_.pooling_ = new ::CoreML::Specification::PoolingLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.pooling)
  return layer_.pooling_;
}